

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_uints(Impl *this,Value *uints,uint32_t **out_uints)

{
  SizeType SVar1;
  uint uVar2;
  uint *puVar3;
  ValueIterator this_00;
  ValueIterator pGVar4;
  uint *puVar5;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(uints);
  puVar3 = ScratchAllocator::allocate_n<unsigned_int>(&this->allocator,(ulong)SVar1);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Begin(uints);
  puVar5 = puVar3;
  while( true ) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(uints);
    if (this_00 == pGVar4) break;
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(this_00);
    *puVar5 = uVar2;
    this_00 = this_00 + 1;
    puVar5 = puVar5 + 1;
  }
  *out_uints = puVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_uints(const Value &uints, const uint32_t **out_uints)
{
	auto *u32s = allocator.allocate_n<uint32_t>(uints.Size());
	auto *ret = u32s;
	for (auto itr = uints.Begin(); itr != uints.End(); ++itr, u32s++)
		*u32s = itr->GetUint();

	*out_uints = ret;
	return true;
}